

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O3

void borg_cheat_inven(void)

{
  object *obj;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char buf [256];
  char local_138;
  undefined7 uStack_137;
  short local_130;
  
  if (z_info->pack_size != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      obj = player->upkeep->inven[uVar4];
      memset(borg_items->desc + lVar3,0,0x388);
      if ((obj != (object *)0x0) && (obj->kind != (object_kind *)0x0)) {
        local_138 = '\0';
        object_desc(&local_138,0x100,obj,3,player);
        if (local_130 != 0x29 || CONCAT71(uStack_137,local_138) != 0x676e6968746f6e28) {
          borg_item_analyze((borg_item_conflict *)(borg_items->desc + lVar3),obj,&local_138,false);
          borg_do_crush_junk = true;
          pcVar2 = borg_items->desc;
          pcVar1 = strchr(pcVar2 + lVar3,0x21);
          if (pcVar1 == (char *)0x0) {
            pcVar2 = strstr(pcVar2 + lVar3,"borg");
            if (pcVar2 == (char *)0x0) goto LAB_0022766c;
          }
          borg_deinscribe((int)uVar4);
        }
      }
LAB_0022766c:
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x388;
    } while (uVar4 < z_info->pack_size);
  }
  return;
}

Assistant:

void borg_cheat_inven(void)
{
    int i;

    char buf[256];

    /* Extract the inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        struct object *obj = player->upkeep->inven[i];
        memset(&borg_items[i], 0, sizeof(borg_item));

        /* Skip non-items */
        if (!obj || !obj->kind)
            continue;

        /* Default to "nothing" */
        buf[0] = '\0';

        /* Describe it */
        object_desc(buf, sizeof(buf), obj, ODESC_FULL, player);

        /* Skip Empty slots */
        if (streq(buf, "(nothing)"))
            continue;

        /* Analyze the item (no price) */
        borg_item_analyze(&borg_items[i], obj, buf, false);

        /* Note changed inventory */
        borg_do_crush_junk = true;

        /* Uninscribe items with ! or borg inscriptions */
        if (strstr(borg_items[i].desc, "!") || strstr(borg_items[i].desc, "borg"))
            borg_deinscribe(i);
    }
}